

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_search_localfile
                 (char **searchpaths,ly_bool cwd,char *name,char *revision,char **localfile,
                 LYS_INFORMAT *format)

{
  DIR *pDVar1;
  char **__s1;
  LY_ERR LVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t __n;
  long local_b0;
  uint64_t i;
  ly_set *plStack_a0;
  LY_ERR ret__;
  ly_set *dirs;
  LYS_INFORMAT match_format;
  LYS_INFORMAT format_aux;
  char *match_name;
  dirent *file;
  DIR *dir;
  char *wd;
  ly_bool skip;
  size_t sStack_68;
  ly_bool implicit_cwd;
  size_t dir_len;
  size_t match_len;
  size_t flen;
  size_t len;
  LYS_INFORMAT *pLStack_40;
  LY_ERR ret;
  LYS_INFORMAT *format_local;
  char **localfile_local;
  char *revision_local;
  char *name_local;
  char **ppcStack_18;
  ly_bool cwd_local;
  char **searchpaths_local;
  
  len._4_4_ = LY_EMEM;
  dir_len = 0;
  wd._7_1_ = '\0';
  file = (dirent *)0x0;
  _match_format = (char *)0x0;
  dirs._0_4_ = LYS_IN_UNKNOWN;
  pLStack_40 = format;
  format_local = (LYS_INFORMAT *)localfile;
  localfile_local = (char **)revision;
  revision_local = name;
  name_local._7_1_ = cwd;
  ppcStack_18 = searchpaths;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","localfile",
           "lys_search_localfile");
    return LY_EINVAL;
  }
  LVar2 = ly_set_new(&stack0xffffffffffffff60);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  flen = strlen(revision_local);
  if (name_local._7_1_ != '\0') {
    dir = (DIR *)get_current_dir_name();
    if (dir == (DIR *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_search_localfile");
      goto LAB_001941ca;
    }
    len._4_4_ = ly_set_add(plStack_a0,dir,'\0',(uint32_t *)0x0);
    if (len._4_4_ != LY_SUCCESS) goto LAB_001941ca;
    wd._7_1_ = '\x01';
  }
  if (ppcStack_18 != (char **)0x0) {
    for (local_b0 = 0; ppcStack_18[local_b0] != (char *)0x0; local_b0 = local_b0 + 1) {
      if ((wd._7_1_ == '\0') ||
         (iVar3 = strcmp((char *)*(plStack_a0->field_2).dnodes,ppcStack_18[local_b0]), iVar3 != 0))
      {
        dir = (DIR *)strdup(ppcStack_18[local_b0]);
        if (dir == (DIR *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_search_localfile");
          goto LAB_001941ca;
        }
        len._4_4_ = ly_set_add(plStack_a0,dir,'\0',(uint32_t *)0x0);
        if (len._4_4_ != LY_SUCCESS) goto LAB_001941ca;
      }
      else {
        wd._7_1_ = '\0';
      }
    }
  }
  dir = (DIR *)0x0;
  while (plStack_a0->count != 0) {
    free(dir);
    plStack_a0->count = plStack_a0->count - 1;
    dir = (DIR *)(plStack_a0->field_2).dnodes[plStack_a0->count];
    (plStack_a0->field_2).dnodes[plStack_a0->count] = (lyd_node *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in \"%s\".",revision_local,dir);
    if (file != (dirent *)0x0) {
      closedir((DIR *)file);
    }
    file = (dirent *)opendir((char *)dir);
    sStack_68 = strlen((char *)dir);
    pDVar1 = dir;
    if (file == (dirent *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
             "Unable to open directory \"%s\" for searching (sub)modules (%s).",pDVar1,pcVar5);
    }
    else {
LAB_00193dc0:
      match_name = (char *)readdir((DIR *)file);
      if ((dirent *)match_name != (dirent *)0x0) {
        iVar3 = strcmp(".",((dirent *)match_name)->d_name);
        if ((iVar3 != 0) && (iVar3 = strcmp("..",match_name + 0x13), iVar3 != 0)) {
          len._4_4_ = lys_search_localfile_file_type
                                ((dirent *)match_name,(char *)dir,plStack_a0,wd._7_1_,
                                 (ly_bool *)((long)&wd + 6));
          if (len._4_4_ != LY_SUCCESS) goto LAB_001941ca;
          iVar3 = strncmp(revision_local,match_name + 0x13,flen);
          if ((iVar3 == 0) && ((match_name[flen + 0x13] == '.' || (match_name[flen + 0x13] == '@')))
             ) {
            match_len = strlen(match_name + 0x13);
            if ((match_len < 6) ||
               (iVar3 = strcmp(match_name + match_len + 0xe,".yang"), iVar3 != 0)) {
              if ((match_len < 5) ||
                 (iVar3 = strcmp(match_name + match_len + 0xf,".yin"), iVar3 != 0))
              goto LAB_00193dc0;
              dirs._4_4_ = LYS_IN_YIN;
            }
            else {
              dirs._4_4_ = LYS_IN_YANG;
            }
            __s1 = localfile_local;
            if (localfile_local != (char **)0x0) {
              if (match_name[flen + 0x13] == '@') {
                pcVar5 = match_name + flen + 0x14;
                __n = strlen((char *)localfile_local);
                iVar3 = strncmp((char *)__s1,pcVar5,__n);
                if (iVar3 == 0) {
                  free(_match_format);
                  iVar3 = asprintf((char **)&match_format,"%s/%s",dir,match_name + 0x13);
                  if (iVar3 == -1) {
                    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "lys_search_localfile");
                    goto LAB_001941ca;
                  }
                  dir_len = sStack_68 + 1 + flen;
                  dirs._0_4_ = dirs._4_4_;
                  break;
                }
              }
              else {
                free(_match_format);
                iVar3 = asprintf((char **)&match_format,"%s/%s",dir,match_name + 0x13);
                if (iVar3 == -1) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_search_localfile");
                  goto LAB_001941ca;
                }
                dir_len = sStack_68 + 1 + flen;
                dirs._0_4_ = dirs._4_4_;
              }
              goto LAB_00193dc0;
            }
            if (_match_format != (char *)0x0) {
              if (match_name[flen + 0x13] != '@') goto LAB_00193dc0;
              iVar3 = 4;
              if (dirs._4_4_ == LYS_IN_YANG) {
                iVar3 = 5;
              }
              LVar2 = lysp_check_date((lysp_ctx *)0x0,match_name + flen + 0x14,
                                      ((match_len - (long)iVar3) - flen) - 1,(char *)0x0);
              if ((LVar2 != LY_SUCCESS) ||
                 ((_match_format[dir_len] == '@' &&
                  (iVar3 = strncmp(_match_format + dir_len + 1,match_name + flen + 0x14,10),
                  -1 < iVar3)))) goto LAB_00193dc0;
              free(_match_format);
            }
            iVar3 = asprintf((char **)&match_format,"%s/%s",dir,match_name + 0x13);
            if (iVar3 == -1) {
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_search_localfile");
              goto LAB_001941ca;
            }
            dir_len = sStack_68 + 1 + flen;
            dirs._0_4_ = dirs._4_4_;
          }
        }
        goto LAB_00193dc0;
      }
    }
  }
  *(char **)format_local = _match_format;
  _match_format = (char *)0x0;
  if (pLStack_40 != (LYS_INFORMAT *)0x0) {
    *pLStack_40 = (LYS_INFORMAT)dirs;
  }
  len._4_4_ = LY_SUCCESS;
LAB_001941ca:
  free(dir);
  if (file != (dirent *)0x0) {
    closedir((DIR *)file);
  }
  free(_match_format);
  ly_set_free(plStack_a0,free);
  return len._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_search_localfile(const char * const *searchpaths, ly_bool cwd, const char *name, const char *revision,
        char **localfile, LYS_INFORMAT *format)
{
    LY_ERR ret = LY_EMEM;
    size_t len, flen, match_len = 0, dir_len;
    ly_bool implicit_cwd = 0, skip;
    char *wd;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    struct ly_set *dirs;

    LY_CHECK_ARG_RET(NULL, localfile, LY_EINVAL);

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    LY_CHECK_RET(ly_set_new(&dirs));

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            ret = ly_set_add(dirs, wd, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (uint64_t i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->objs[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else {
                ret = ly_set_add(dirs, wd, 0, NULL);
                LY_CHECK_GOTO(ret, cleanup);
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->count) {
        free(wd);

        dirs->count--;
        wd = (char *)dirs->objs[dirs->count];
        dirs->objs[dirs->count] = NULL;
        LOGVRB("Searching for \"%s\" in \"%s\".", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
            continue;
        }

        /* search the directory */
        while ((file = readdir(dir))) {
            if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                /* skip . and .. */
                continue;
            }

            /* check whether file type is */
            if ((ret = lys_search_localfile_file_type(file, wd, dirs, implicit_cwd, &skip))) {
                goto cleanup;
            }

            /* here we know that the item is a file which can contain a module */
            if (strncmp(name, file->d_name, len) || ((file->d_name[len] != '.') && (file->d_name[len] != '@'))) {
                /* different filename than the module we search for */
                continue;
            }

            /* get type according to filename suffix */
            flen = strlen(file->d_name);
            if ((flen >= LY_YANG_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YANG_SUFFIX_LEN], LY_YANG_SUFFIX)) {
                format_aux = LYS_IN_YANG;
            } else if ((flen >= LY_YIN_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YIN_SUFFIX_LEN], LY_YIN_SUFFIX)) {
                format_aux = LYS_IN_YIN;
            } else {
                /* not supported suffix/file format */
                continue;
            }

            if (revision) {
                /* we look for the specific revision, try to get it from the filename */
                if (file->d_name[len] == '@') {
                    /* check revision from the filename */
                    if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                        /* another revision */
                        continue;
                    } else {
                        /* exact revision */
                        free(match_name);
                        if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                            LOGMEM(NULL);
                            goto cleanup;
                        }
                        match_len = dir_len + 1 + len;
                        match_format = format_aux;
                        goto success;
                    }
                } else {
                    /* continue trying to find exact revision match, use this only if not found */
                    free(match_name);
                    if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                        LOGMEM(NULL);
                        goto cleanup;
                    }
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            } else {
                /* remember the revision and try to find the newest one */
                if (match_name) {
                    if ((file->d_name[len] != '@') ||
                            lysp_check_date(NULL, &file->d_name[len + 1],
                            flen - ((format_aux == LYS_IN_YANG) ? LY_YANG_SUFFIX_LEN : LY_YIN_SUFFIX_LEN) - len - 1, NULL)) {
                        continue;
                    } else if ((match_name[match_len] == '@') &&
                            (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                        continue;
                    }
                    free(match_name);
                }

                if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                match_len = dir_len + 1 + len;
                match_format = format_aux;
                continue;
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = LY_SUCCESS;

cleanup:
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    ly_set_free(dirs, free);

    return ret;
}